

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

void __thiscall
fmt::v7::detail::iterator_buffer<char_*,_char,_fmt::v7::detail::fixed_buffer_traits>::grow
          (iterator_buffer<char_*,_char,_fmt::v7::detail::fixed_buffer_traits> *this,size_t param_1)

{
  ulong uVar1;
  ulong uVar2;
  ptrdiff_t _Num;
  char *__dest;
  size_t __n;
  
  if ((this->super_buffer<char>).size_ == 0x100) {
    uVar1 = (this->super_fixed_buffer_traits).count_;
    uVar2 = (this->super_fixed_buffer_traits).limit_;
    (this->super_fixed_buffer_traits).count_ = uVar1 + 0x100;
    __dest = this->out_;
    if (uVar1 < uVar2) {
      __n = 0;
      if (uVar1 <= uVar2) {
        __n = uVar2 - uVar1;
      }
      if (0xff < __n) {
        __n = 0x100;
      }
      memmove(__dest,this->data_,__n);
      __dest = __dest + __n;
    }
    this->out_ = __dest;
    (this->super_buffer<char>).size_ = 0;
  }
  return;
}

Assistant:

size_t size() const FMT_NOEXCEPT { return size_; }